

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexConvexAlgorithm.h
# Opt level: O1

void __thiscall
btConvexConvexAlgorithm::getAllContactManifolds
          (btConvexConvexAlgorithm *this,btManifoldArray *manifoldArray)

{
  int iVar1;
  btPersistentManifold **ppbVar2;
  long lVar3;
  int iVar4;
  
  if ((this->m_manifoldPtr != (btPersistentManifold *)0x0) && (this->m_ownManifold == true)) {
    iVar1 = manifoldArray->m_size;
    if (iVar1 == manifoldArray->m_capacity) {
      iVar4 = 1;
      if (iVar1 != 0) {
        iVar4 = iVar1 * 2;
      }
      if (manifoldArray->m_capacity < iVar4) {
        if (iVar4 == 0) {
          ppbVar2 = (btPersistentManifold **)0x0;
        }
        else {
          ppbVar2 = (btPersistentManifold **)btAlignedAllocInternal((long)iVar4 << 3,0x10);
        }
        iVar1 = manifoldArray->m_size;
        if (0 < (long)iVar1) {
          lVar3 = 0;
          do {
            ppbVar2[lVar3] = manifoldArray->m_data[lVar3];
            lVar3 = lVar3 + 1;
          } while (iVar1 != lVar3);
        }
        if (manifoldArray->m_data != (btPersistentManifold **)0x0) {
          if (manifoldArray->m_ownsMemory == true) {
            btAlignedFreeInternal(manifoldArray->m_data);
          }
          manifoldArray->m_data = (btPersistentManifold **)0x0;
        }
        manifoldArray->m_ownsMemory = true;
        manifoldArray->m_data = ppbVar2;
        manifoldArray->m_capacity = iVar4;
      }
    }
    iVar1 = manifoldArray->m_size;
    manifoldArray->m_data[iVar1] = this->m_manifoldPtr;
    manifoldArray->m_size = iVar1 + 1;
  }
  return;
}

Assistant:

virtual	void	getAllContactManifolds(btManifoldArray&	manifoldArray)
	{
		///should we use m_ownManifold to avoid adding duplicates?
		if (m_manifoldPtr && m_ownManifold)
			manifoldArray.push_back(m_manifoldPtr);
	}